

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O3

int id_resize(nni_id_map *m)

{
  nni_id_entry *pnVar1;
  nni_id_entry *pnVar2;
  uint32_t uVar3;
  nni_id_entry *ptr;
  uint uVar4;
  nni_id_map **__dest;
  long lVar5;
  nni_id_entry *pnVar6;
  void *pvVar7;
  uint uVar8;
  uint64_t uVar9;
  uint32_t uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  
  if ((m->id_load < m->id_max_load) && (m->id_min_load <= m->id_load)) {
LAB_00112a77:
    iVar13 = 0;
  }
  else {
    if ((m->id_flags & 5) == 1) {
      nni_mtx_lock(&id_reg_mtx);
      __dest = id_reg_map;
      if (id_reg_num < id_reg_len) {
LAB_00112a32:
        id_reg_map = __dest;
        lVar5 = (long)id_reg_num;
        id_reg_num = id_reg_num + 1;
        id_reg_map[lVar5] = m;
        *(byte *)&m->id_flags = (byte)m->id_flags | 4;
        nni_mtx_unlock(&id_reg_mtx);
        goto LAB_00112a58;
      }
      uVar11 = 10;
      if (9 < id_reg_len) {
        uVar11 = (ulong)(uint)(id_reg_len * 2);
      }
      __dest = (nni_id_map **)nni_zalloc(uVar11 * 8);
      iVar13 = id_reg_num;
      if (__dest != (nni_id_map **)0x0) {
        id_reg_len = (int)uVar11;
        id_reg_num = iVar13;
        if (id_reg_map != (nni_id_map **)0x0) {
          memcpy(__dest,id_reg_map,(long)id_reg_num << 3);
          id_reg_num = iVar13;
        }
        goto LAB_00112a32;
      }
      nni_mtx_unlock(&id_reg_mtx);
    }
    else {
LAB_00112a58:
      uVar11 = (ulong)m->id_cap;
      uVar4 = 8;
      do {
        uVar15 = uVar4;
        uVar4 = uVar15 * 2;
      } while (uVar15 < m->id_count * 2);
      if (uVar15 == m->id_cap) goto LAB_00112a77;
      ptr = m->id_entries;
      pnVar6 = (nni_id_entry *)nni_zalloc((ulong)uVar15 * 0x18);
      if (pnVar6 != (nni_id_entry *)0x0) {
        m->id_entries = pnVar6;
        m->id_cap = uVar15;
        m->id_load = 0;
        uVar4 = 5;
        uVar8 = 0;
        if (8 < uVar15) {
          uVar8 = uVar15 >> 3;
          uVar4 = (uVar15 * 2) / 3;
        }
        m->id_min_load = uVar8;
        m->id_max_load = uVar4;
        if (uVar11 == 0) {
          return 0;
        }
        uVar14 = 0;
        do {
          pvVar7 = ptr[uVar14].val;
          if (pvVar7 != (void *)0x0) {
            pnVar1 = ptr + uVar14;
            uVar9 = pnVar1->key;
            uVar12 = (ulong)((uint)uVar9 & uVar15 - 1);
            uVar10 = m->id_load + 1;
            if (pnVar6[uVar12].val != (void *)0x0) {
              uVar3 = m->id_cap;
              do {
                pnVar6[uVar12].skips = pnVar6[uVar12].skips + 1;
                uVar12 = (ulong)((int)uVar12 * 5 + 1U & uVar3 - 1);
                uVar10 = uVar10 + 1;
              } while (pnVar6[uVar12].val != (void *)0x0);
            }
            pnVar2 = pnVar6 + uVar12;
            m->id_load = uVar10;
            if (pnVar2->skips != 0) {
              nni_panic("%s: %d: assert err: %s",
                        "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/idhash.c"
                        ,0xdd,"new_entries[index].skips == 0");
              uVar9 = pnVar1->key;
              pvVar7 = pnVar1->val;
            }
            pnVar2->val = pvVar7;
            pnVar2->key = uVar9;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar11);
        if (uVar11 == 0) {
          return 0;
        }
        nni_free(ptr,uVar11 * 0x18);
        return 0;
      }
    }
    iVar13 = 2;
  }
  return iVar13;
}

Assistant:

static int
id_resize(nni_id_map *m)
{
	nni_id_entry *new_entries;
	nni_id_entry *old_entries;
	uint32_t      new_cap;
	uint32_t      old_cap;
	uint32_t      i;
	int           rv;

	if ((m->id_load < m->id_max_load) && (m->id_load >= m->id_min_load)) {
		// No resize needed.
		return (0);
	}

	// if it is a statically declared map, register it so that we
	// will free it at finalization time
	if ((rv = id_map_register(m)) != 0) {
		return (rv);
	}

	old_cap = m->id_cap;
	new_cap = 8;
	while (new_cap < (m->id_count * 2)) {
		new_cap *= 2;
	}
	if (new_cap == old_cap) {
		// Same size.
		return (0);
	}

	old_entries = m->id_entries;
	new_entries = NNI_ALLOC_STRUCTS(new_entries, new_cap);
	if (new_entries == NULL) {
		return (NNG_ENOMEM);
	}

	m->id_entries = new_entries;
	m->id_cap     = new_cap;
	m->id_load    = 0;
	if (new_cap > 8) {
		m->id_min_load = new_cap / 8;
		m->id_max_load = new_cap * 2 / 3;
	} else {
		m->id_min_load = 0;
		m->id_max_load = 5;
	}
	for (i = 0; i < old_cap; i++) {
		size_t index;
		if (old_entries[i].val == NULL) {
			continue;
		}
		index = old_entries[i].key & (new_cap - 1);
		for (;;) {
			// Increment the load unconditionally.  It counts
			// once for every item stored, plus once for each
			// hashing operation we use to store the item (i.e.
			// one for the item, plus once for each rehash.)
			m->id_load++;
			if (new_entries[index].val == NULL) {
				// As we are hitting this entry for the first
				// time, it won't have any skips.
				NNI_ASSERT(new_entries[index].skips == 0);
				new_entries[index].val = old_entries[i].val;
				new_entries[index].key = old_entries[i].key;
				break;
			}
			new_entries[index].skips++;
			index = ID_NEXT(m, index);
		}
	}
	if (old_cap != 0) {
		NNI_FREE_STRUCTS(old_entries, old_cap);
	}
	return (0);
}